

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O3

int http_message_needs_eof(http_parser *parser)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar2 = *(uint *)parser;
  bVar3 = false;
  bVar4 = false;
  if (((uVar2 & 3) != 0) && (bVar4 = bVar3, (uVar2 >> 8 & 1) == 0)) {
    uVar1 = *(ushort *)&parser->field_0x14;
    if ((uVar1 != 0x130) &&
       (((uVar1 != 0xcc && (uVar1 - 200 < 0xffffff9c)) &&
        (bVar4 = (uVar2 & 0x20000004) == 0x20000000, (char)((uVar2 & 4) >> 2) == '\0' && !bVar4))))
    {
      bVar4 = parser->content_length == 0xffffffffffffffff;
    }
  }
  return (int)bVar4;
}

Assistant:

int
http_message_needs_eof (const http_parser *parser)
{
  if (parser->type == HTTP_REQUEST) {
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (parser->status_code / 100 == 1 || /* 1xx e.g. Continue */
      parser->status_code == 204 ||     /* No Content */
      parser->status_code == 304 ||     /* Not Modified */
      parser->flags & F_SKIPBODY) {     /* response to a HEAD request */
    return 0;
  }

  /* RFC 7230 3.3.3, see `s_headers_almost_done` */
  if ((parser->extra_flags & (F_TRANSFER_ENCODING >> 8)) &&
      (parser->flags & F_CHUNKED) == 0) {
    return 1;
  }

  if ((parser->flags & F_CHUNKED) || parser->content_length != ULLONG_MAX) {
    return 0;
  }

  return 1;
}